

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCDecoder.cpp
# Opt level: O0

bool __thiscall gnilk::IPCBinaryDecoder::Process(IPCBinaryDecoder *this)

{
  byte bVar1;
  int iVar2;
  long *plVar3;
  IPCDeserializer *handler;
  IPCMsgHeader header;
  IPCBinaryDecoder *this_local;
  undefined4 extraout_var;
  
  header = (IPCMsgHeader)this;
  IPCMsgHeader::IPCMsgHeader((IPCMsgHeader *)&handler);
  iVar2 = (**(this->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader)(this,&handler,8);
  if (iVar2 < 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = (*(this->deserializer->super_IPCObject)._vptr_IPCObject[2])
                      (this->deserializer,(ulong)handler._1_1_);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar3 == (long *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = (**(code **)(*plVar3 + 0x18))(plVar3,this);
      this_local._7_1_ = (bool)(bVar1 & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool IPCBinaryDecoder::Process() {
    IPCMsgHeader header;
    if (Read(&header, sizeof(header)) < 0) {
        return false;
    }
    auto handler = deserializer.GetDeserializerForObject(header.msgId);
    if (handler == nullptr) {
        return false;
    }
    return handler->Unmarshal(*this);
}